

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StuntDouble.hpp
# Opt level: O0

Vector3d * __thiscall OpenMD::StuntDouble::lab2Body(StuntDouble *this,Vector3d *v)

{
  StuntDouble *in_RDI;
  Vector<double,_3U> *in_stack_ffffffffffffff58;
  StuntDouble *pSVar1;
  Vector<double,_3U> *in_stack_ffffffffffffff80;
  RectMatrix<double,_3U,_3U> *in_stack_ffffffffffffff88;
  
  pSVar1 = in_RDI;
  getA(in_RDI);
  OpenMD::operator*(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  Vector3<double>::Vector3((Vector3<double> *)in_RDI,in_stack_ffffffffffffff58);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x23ea57);
  return (Vector3d *)pSVar1;
}

Assistant:

Vector3d lab2Body(const Vector3d& v) { return getA() * v; }